

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int level)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  
  if ((this->trail_lim).sz <= level) {
    return;
  }
  iVar4 = (this->trail).sz;
  lVar5 = (long)iVar4;
  piVar1 = (this->trail_lim).data;
  iVar2 = piVar1[level];
  if (iVar2 < iVar4) {
    do {
      lVar5 = lVar5 + -1;
      iVar4 = (this->trail).data[lVar5].x >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar4) {
        pcVar3 = 
        "V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
        goto LAB_00108cc7;
      }
      (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
      [iVar4].value = l_Undef;
      if ((1 < this->phase_saving) ||
         ((this->phase_saving == 1 &&
          ((this->trail_lim).data[(long)(this->trail_lim).sz + -1] < lVar5)))) {
        if (iVar4 < (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz)
        {
          (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar4] =
               (byte)(this->trail).data[lVar5].x & 1;
          goto LAB_00108c0f;
        }
LAB_00108c9b:
        pcVar3 = 
        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_00108cc7:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,pcVar3);
      }
LAB_00108c0f:
      if (((this->order_heap).indices.map.sz <= iVar4) ||
         ((this->order_heap).indices.map.data[iVar4] < 0)) {
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar4)
        goto LAB_00108c9b;
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar4]
            != '\0') {
          Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                    (&this->order_heap,iVar4);
        }
      }
      piVar1 = (this->trail_lim).data;
      iVar2 = piVar1[level];
    } while (iVar2 < lVar5);
  }
  this->qhead = iVar2;
  iVar4 = piVar1[level];
  if (iVar4 < 0) {
    pcVar3 = "void Minisat::vec<Minisat::Lit>::shrink(Size) [T = Minisat::Lit, _Size = int]";
  }
  else {
    if (iVar4 < (this->trail).sz) {
      (this->trail).sz = iVar4;
    }
    if (-1 < level) {
      if ((this->trail_lim).sz <= level) {
        return;
      }
      (this->trail_lim).sz = level;
      return;
    }
    pcVar3 = "void Minisat::vec<int>::shrink(Size) [T = int, _Size = int]";
  }
  __assert_fail("nelems <= sz",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                ,0x41,pcVar3);
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || (phase_saving == 1 && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } }